

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SelectionSet::nextOffBit(SelectionSet *this,vector<int,_std::allocator<int>_> *fromIndex)

{
  reference pvVar1;
  OpenMDBitSet *in_RDX;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RSI;
  allocator_type *in_RDI;
  int i;
  vector<int,_std::allocator<int>_> *result;
  int in_stack_ffffffffffffffa4;
  allocator_type *this_00;
  undefined4 local_30;
  
  this_00 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x37f643);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)in_RSI,in_RDI);
  std::allocator<int>::~allocator((allocator<int> *)0x37f663);
  for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RSI,(long)local_30);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_RDX,(long)local_30);
    in_stack_ffffffffffffffa4 = OpenMDBitSet::nextOffBit(in_RDX,in_stack_ffffffffffffffa4);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)this_00,(long)local_30);
    *pvVar1 = in_stack_ffffffffffffffa4;
  }
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<int> SelectionSet::nextOffBit(std::vector<int> fromIndex) const {
    std::vector<int> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].nextOffBit(fromIndex[i]);
    return result;
  }